

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checksum.cpp
# Opt level: O2

string * computeChecksum_abi_cxx11_(string *__return_storage_ptr__,void *data,int length)

{
  uint *puVar1;
  int i;
  long lVar2;
  BYTE hash [32];
  ostringstream ss;
  byte local_1b8 [40];
  long local_190 [3];
  uint auStack_178 [88];
  
  sha256(data,length,local_1b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
         *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
    puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    std::ostream::operator<<((ostringstream *)local_190,(uint)local_1b8[lVar2]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string computeChecksum(const void* data, int length)
{
    BYTE hash[32];
    sha256(data, length, hash);

    std::ostringstream ss;
    for (int i = 0; i < 32; ++i)
        ss << std::hex << std::uppercase << static_cast<int>(hash[i]);

    return ss.str();
}